

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-memory-read-test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__stream;
  size_t size_00;
  int error_3;
  int error_2;
  char data [256];
  int error_1;
  int error;
  size_t size;
  FILE *fp;
  mtar_header_t h;
  mtar_t tar;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("error: no argument\n");
    argv_local._4_4_ = 1;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      printf("error: unable to open\n");
      argv_local._4_4_ = 6;
    }
    else {
      size_00 = fread(main::buf,1,4000,__stream);
      if (size_00 == 0) {
        printf("error: unable to read\n");
        fclose(__stream);
        argv_local._4_4_ = 7;
      }
      else {
        fclose(__stream);
        uVar1 = mtar_open_memory((mtar_t *)(h.linkname + 0x5c),main::buf,size_00);
        if (uVar1 == 0) {
          while (uVar1 = mtar_read_header((mtar_t *)(h.linkname + 0x5c),(mtar_header_t *)&fp),
                uVar1 == 0) {
            printf("%s (%d bytes)\n",&h.mtime,h._0_8_ & 0xffffffff);
            if (0x100 < h._0_8_ + 1) {
              printf("error: too large\n");
              return 6;
            }
            uVar1 = mtar_read_data((mtar_t *)(h.linkname + 0x5c),&error_3,h._0_8_);
            if (uVar1 != 0) {
              printf("error: %d\n",(ulong)uVar1);
              return 4;
            }
            *(undefined1 *)((long)&error_3 + h._0_8_) = 0;
            puts((char *)&error_3);
            mtar_next((mtar_t *)(h.linkname + 0x5c));
          }
          if (uVar1 == 0xfffffff9) {
            uVar1 = mtar_close((mtar_t *)(h.linkname + 0x5c));
            if (uVar1 == 0) {
              puts("success");
              argv_local._4_4_ = 0;
            }
            else {
              printf("error: %d\n",(ulong)uVar1);
              argv_local._4_4_ = 3;
            }
          }
          else {
            printf("error: %d\n",(ulong)uVar1);
            argv_local._4_4_ = 5;
          }
        }
        else {
          printf("error: %d\n",(ulong)uVar1);
          argv_local._4_4_ = 2;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    mtar_header_t h;

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    if (!fp)
    {
        printf("error: unable to open\n");
        return 6;
    }

    static char buf[4000];
    size_t size = fread(buf, 1, 4000, fp);
    if (!size)
    {
        printf("error: unable to read\n");
        fclose(fp);
        return 7;
    }
    fclose(fp);

    if (int error = mtar_open_memory(&tar, buf, size))
    {
        printf("error: %d\n", error);
        return 2;
    }

    for (;;)
    {
        if (int error = mtar_read_header(&tar, &h))
        {
            if (error == MTAR_ENULLRECORD)
            {
                break;
            }
            printf("error: %d\n", error);
            return 5;
        }
        printf("%s (%d bytes)\n", h.name, (int)h.size);

        char data[256];
        if (h.size + 1 > sizeof(data))
        {
            printf("error: too large\n");
            return 6;
        }

        if (int error = mtar_read_data(&tar, data, h.size))
        {
            printf("error: %d\n", error);
            return 4;
        }
        data[h.size] = 0;

        puts(data);
        mtar_next(&tar);
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    puts("success");
    return 0;
}